

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

void __thiscall
bench::show_to_console
          (bench *this,vector<bench::element,_std::allocator<bench::element>_> *current,string *name
          )

{
  ulong uVar1;
  double dVar2;
  pointer psVar3;
  pointer psVar4;
  pointer peVar5;
  pointer pdVar6;
  pointer peVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  pointer pmVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  pointer pmVar14;
  pointer pmVar15;
  ulong uVar16;
  size_type sVar17;
  long lVar18;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  size_type __n;
  pointer pmVar19;
  size_t end_solver;
  long lVar20;
  long lVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  double dVar31;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  string_view format_str_04;
  string_view format_str_05;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_05;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_06;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_07;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_08;
  vector<int,_std::allocator<int>_> row_length;
  undefined8 local_e0;
  undefined1 local_d8;
  undefined1 local_d4;
  undefined2 local_d0;
  undefined1 local_ce;
  pointer local_c8;
  ulong uStack_c0;
  ulong local_b8;
  ulong local_a8;
  pointer local_a0;
  pointer local_98;
  vector<bench::element,_std::allocator<bench::element>_> *local_90;
  undefined1 local_88 [16];
  vector<int,_std::allocator<int>_> local_70;
  undefined1 local_58 [16];
  string *local_40;
  ulong local_38;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  local_58._8_8_ = local_58._0_8_;
  pmVar15 = (this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>._M_impl.
            super__Vector_impl_data._M_start;
  pmVar19 = (this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_98 = (pointer)(((long)pmVar19 - (long)pmVar15 >> 3) * -0x3333333333333333);
  psVar3 = (this->solvers).super__Vector_base<bench::solver,_std::allocator<bench::solver>_>._M_impl
           .super__Vector_impl_data._M_finish;
  psVar4 = (this->solvers).super__Vector_base<bench::solver,_std::allocator<bench::solver>_>._M_impl
           .super__Vector_impl_data._M_start;
  local_88._8_8_ = local_88._0_8_;
  local_88._0_8_ = psVar4;
  __n = (long)psVar3 - (long)psVar4 >> 5;
  local_c8 = (pointer)CONCAT44(local_c8._4_4_,5);
  local_90 = current;
  local_40 = name;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_70,__n,(value_type_conflict3 *)&local_c8,(allocator_type *)&local_e0);
  local_58._0_8_ = pmVar15;
  local_a0 = pmVar19;
  if (pmVar19 != pmVar15) {
    lVar21 = 0;
    pmVar15 = (pointer)0x0;
    do {
      if (psVar3 != (pointer)local_88._0_8_) {
        sVar17 = 0;
        do {
          uVar16 = *(ulong *)((long)(this->array).m_data.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start +
                             sVar17 * 8 + (this->array).m_line_size * lVar21);
          if ((uVar16 & 0x7fffffffffffffff) != 0x7ff0000000000000) {
            auVar23._8_8_ = 0x7fffffffffffffff;
            auVar23._0_8_ = 0x7fffffffffffffff;
            auVar25._8_8_ = 0;
            auVar25._0_8_ = uVar16;
            auVar23 = vpandq_avx512vl(auVar25,auVar23);
            auVar28._0_8_ = log10(auVar23._0_8_);
            auVar28._8_56_ = extraout_var;
            auVar23 = vroundsd_avx(auVar28._0_16_,auVar28._0_16_,9);
            iVar11 = (int)auVar23._0_8_ + 5;
            if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[sVar17] < iVar11) {
              local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[sVar17] = iVar11;
            }
          }
          sVar17 = sVar17 + 1;
        } while (__n != sVar17);
      }
      pmVar15 = (pointer)((long)&(pmVar15->m_name)._M_dataplus._M_p + 1);
      lVar21 = lVar21 + 8;
    } while (pmVar15 != local_98);
  }
  if (local_a0 == (pointer)local_58._0_8_) {
    uVar16 = 10;
  }
  else {
    uVar16 = 10;
    lVar21 = 8;
    pmVar15 = local_98;
    do {
      peVar5 = (local_90->super__Vector_base<bench::element,_std::allocator<bench::element>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((*(char *)((long)&peVar5->solution + lVar21) == '\x01') &&
         (uVar1 = *(ulong *)((long)peVar5 + lVar21 + -8),
         (uVar1 & 0x7fffffffffffffff) != 0x7ff0000000000000)) {
        auVar8._8_8_ = 0x7fffffffffffffff;
        auVar8._0_8_ = 0x7fffffffffffffff;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = uVar1;
        auVar23 = vpandq_avx512vl(auVar26,auVar8);
        auVar29._0_8_ = log10(auVar23._0_8_);
        auVar29._8_56_ = extraout_var_00;
        auVar23 = vroundsd_avx(auVar29._0_16_,auVar29._0_16_,9);
        uVar12 = (int)auVar23._0_8_ + 5;
        if ((int)uVar16 < (int)uVar12) {
          uVar16 = (ulong)uVar12;
        }
      }
      lVar21 = lVar21 + 0x10;
      pmVar15 = (pointer)&pmVar15[-1].field_0x27;
    } while (pmVar15 != (pointer)0x0);
  }
  pmVar15 = (this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>._M_impl.
            super__Vector_impl_data._M_start;
  pmVar19 = (this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pmVar14 = pmVar15 + 1;
  if (pmVar14 != pmVar19 && pmVar15 != pmVar19) {
    do {
      pmVar10 = pmVar14;
      if ((pmVar14->m_name)._M_string_length <= (pmVar15->m_name)._M_string_length) {
        pmVar10 = pmVar15;
      }
      pmVar15 = pmVar10;
      pmVar14 = pmVar14 + 1;
    } while (pmVar14 != pmVar19);
  }
  uVar1 = (pmVar15->m_name)._M_string_length;
  local_b8 = 4;
  if (4 < uVar1) {
    local_b8 = uVar1;
  }
  local_c8 = "file";
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       &local_c8;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = 0x4c;
  format_str.size_ = 9;
  format_str.data_ = "{:^{}} | ";
  local_a8 = uVar16;
  local_38 = local_b8;
  ::fmt::v7::vprint(_stdout,format_str,args);
  if (psVar3 != (pointer)local_88._0_8_) {
    lVar21 = 0;
    do {
      psVar3 = (this->solvers).super__Vector_base<bench::solver,_std::allocator<bench::solver>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_c8 = (&(psVar3->m_name)._M_dataplus)[lVar21]._M_p;
      uStack_c0 = (&(psVar3->m_name)._M_string_length)[lVar21];
      if (9 < uStack_c0) {
        uStack_c0 = 10;
      }
      local_b8 = (ulong)*(uint *)((long)local_70.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start + lVar21);
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           &local_c8;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = 0x1d;
      format_str_00.size_ = 7;
      format_str_00.data_ = "{:>{}} ";
      ::fmt::v7::vprint(_stdout,format_str_00,args_00);
      lVar21 = lVar21 + 4;
      __n = __n - 1;
    } while (__n != 0);
  }
  local_c8 = (local_40->_M_dataplus)._M_p;
  uStack_c0 = local_40->_M_string_length;
  local_b8 = local_a8;
  args_01.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       &local_c8;
  args_01.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = 0x1d;
  format_str_01.size_ = 7;
  format_str_01.data_ = "{:>{}}\n";
  ::fmt::v7::vprint(_stdout,format_str_01,args_01);
  if (local_a0 != (pointer)local_58._0_8_) {
    lVar21 = 0;
    pmVar15 = (pointer)0x0;
    do {
      pmVar19 = (this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>.
                _M_impl.super__Vector_impl_data._M_start + (long)pmVar15;
      local_c8 = (pmVar19->m_name)._M_dataplus._M_p;
      uStack_c0 = (pmVar19->m_name)._M_string_length;
      local_b8 = local_38;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           &local_c8;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = 0x4d;
      format_str_02.size_ = 9;
      format_str_02.data_ = "{:^{}} | ";
      ::fmt::v7::vprint(_stdout,format_str_02,args_02);
      psVar3 = (this->solvers).super__Vector_base<bench::solver,_std::allocator<bench::solver>_>.
               _M_impl.super__Vector_impl_data._M_start;
      psVar4 = (this->solvers).super__Vector_base<bench::solver,_std::allocator<bench::solver>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      lVar20 = (long)psVar4 - (long)psVar3 >> 5;
      auVar24 = ZEXT816(0x7fefffffffffffff);
      local_58 = ZEXT816(0xffefffffffffffff);
      if (psVar4 != psVar3) {
        lVar18 = 0;
        local_58 = ZEXT816(0xffefffffffffffff);
        auVar24 = ZEXT816(0x7fefffffffffffff);
        do {
          uVar16 = *(ulong *)((long)(this->array).m_data.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start +
                             lVar18 * 8 + (this->array).m_line_size * lVar21);
          bVar22 = (uVar16 & 0x7fffffffffffffff) == 0x7ff0000000000000;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = uVar16;
          auVar23 = vminsd_avx(auVar30,auVar24);
          auVar24._0_8_ = (ulong)bVar22 * auVar24._0_8_ + (ulong)!bVar22 * auVar23._0_8_;
          auVar24._8_8_ = auVar23._8_8_;
          auVar23 = vmaxsd_avx(auVar30,local_58);
          local_58._0_8_ = (ulong)bVar22 * local_58._0_8_ + (ulong)!bVar22 * auVar23._0_8_;
          local_58._8_8_ = auVar23._8_8_;
          lVar18 = lVar18 + 1;
        } while (lVar20 != lVar18);
      }
      peVar5 = (local_90->super__Vector_base<bench::element,_std::allocator<bench::element>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if (peVar5[(long)pmVar15].success != false) {
        dVar31 = peVar5[(long)pmVar15].solution;
        bVar22 = ABS(dVar31) == INFINITY;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = dVar31;
        auVar23 = vminsd_avx(auVar27,auVar24);
        auVar24._0_8_ = (ulong)bVar22 * auVar24._0_8_ + (ulong)!bVar22 * auVar23._0_8_;
        auVar24._8_8_ = auVar23._8_8_;
        auVar23 = vmaxsd_avx(auVar27,local_58);
        local_58._0_8_ = (ulong)bVar22 * local_58._0_8_ + (ulong)!bVar22 * auVar23._0_8_;
        local_58._8_8_ = auVar23._8_8_;
      }
      dVar31 = auVar24._0_8_;
      local_a0 = pmVar15;
      if (psVar4 != psVar3) {
        lVar18 = 0;
        local_88 = auVar24;
        do {
          lVar13 = (this->array).m_line_size * lVar21;
          pdVar6 = (this->array).m_data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar31 = *(double *)((long)pdVar6 + lVar18 * 8 + lVar13);
          if ((dVar31 != local_88._0_8_) || (NAN(dVar31) || NAN(local_88._0_8_))) {
            if ((dVar31 != (double)local_58._0_8_) || (NAN(dVar31) || NAN((double)local_58._0_8_)))
            {
              local_c8 = *(pointer *)((long)pdVar6 + lVar18 * 8 + lVar13);
              local_b8 = (ulong)(uint)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start[lVar18];
              args_03.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .field_1.values_ =
                   (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)&local_c8;
              args_03.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .desc_ = 0x1a;
              format_str_03.size_ = 10;
              format_str_03.data_ = "{:>{}.3f} ";
              ::fmt::v7::vprint(_stdout,format_str_03,args_03);
            }
            else {
              local_d8 = 0;
              local_d4 = 0;
              local_ce = 0;
              local_e0 = 0xff00000001;
              local_d0 = 1;
              local_c8 = *(pointer *)((long)pdVar6 + lVar18 * 8 + lVar13);
              local_b8 = (ulong)(uint)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start[lVar18];
              args_06.field_1.values_ = in_R9.values_;
              args_06.desc_ = (unsigned_long_long)&local_c8;
              ::fmt::v7::vprint<char[11],char>
                        ((v7 *)_stdout,(FILE *)&local_e0,(text_style *)"{:>{}.3f} ",
                         (char (*) [11])0x1a,args_06);
            }
          }
          else {
            local_d8 = 0;
            local_d4 = 0;
            local_ce = 0;
            local_e0 = 0x800000000001;
            local_d0 = 1;
            local_c8 = *(pointer *)((long)pdVar6 + lVar18 * 8 + lVar13);
            local_b8 = (ulong)(uint)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[lVar18];
            args_05.field_1.values_ = in_R9.values_;
            args_05.desc_ = (unsigned_long_long)&local_c8;
            ::fmt::v7::vprint<char[11],char>
                      ((v7 *)_stdout,(FILE *)&local_e0,(text_style *)"{:>{}.3f} ",
                       (char (*) [11])0x1a,args_05);
          }
          dVar31 = local_88._0_8_;
          lVar18 = lVar18 + 1;
        } while (lVar20 != lVar18);
      }
      pmVar19 = local_a0;
      peVar7 = (local_90->super__Vector_base<bench::element,_std::allocator<bench::element>_>).
               _M_impl.super__Vector_impl_data._M_start;
      peVar5 = peVar7 + (long)pmVar15;
      dVar2 = peVar7[(long)pmVar15].solution;
      if ((dVar2 != dVar31) || (NAN(dVar2) || NAN(dVar31))) {
        if ((dVar2 != (double)local_58._0_8_) || (NAN(dVar2) || NAN((double)local_58._0_8_))) {
          local_c8 = (pointer)peVar5->solution;
          local_b8 = local_a8;
          args_04.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ =
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&local_c8;
          args_04.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = 0x1a;
          format_str_05.size_ = 10;
          format_str_05.data_ = "{:>{}.3f} ";
          ::fmt::v7::vprint(_stdout,format_str_05,args_04);
        }
        else {
          local_d8 = 0;
          local_d4 = 0;
          local_ce = 0;
          local_e0 = 0xff00000001;
          local_d0 = 1;
          local_c8 = (pointer)peVar5->solution;
          local_b8 = local_a8;
          args_08.field_1.values_ = in_R9.values_;
          args_08.desc_ = (unsigned_long_long)&local_c8;
          ::fmt::v7::vprint<char[11],char>
                    ((v7 *)_stdout,(FILE *)&local_e0,(text_style *)"{:>{}.3f} ",(char (*) [11])0x1a,
                     args_08);
        }
      }
      else {
        local_d8 = 0;
        local_d4 = 0;
        local_ce = 0;
        local_e0 = 0x800000000001;
        local_d0 = 1;
        local_c8 = (pointer)peVar5->solution;
        local_b8 = local_a8;
        args_07.field_1.values_ = in_R9.values_;
        args_07.desc_ = (unsigned_long_long)&local_c8;
        ::fmt::v7::vprint<char[11],char>
                  ((v7 *)_stdout,(FILE *)&local_e0,(text_style *)"{:>{}.3f} ",(char (*) [11])0x1a,
                   args_07);
        pmVar19 = local_a0;
      }
      local_c8 = (pointer)0x0;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = &local_c8;
      format_str_04.size_ = 1;
      format_str_04.data_ = "\n";
      ::fmt::v7::vprint(_stdout,format_str_04,(format_args)(auVar9 << 0x40));
      pmVar15 = (pointer)((long)&(pmVar19->m_name)._M_dataplus._M_p + 1);
      lVar21 = lVar21 + 8;
    } while (pmVar15 != local_98);
  }
  if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void show_to_console(const std::vector<element>& current, std::string name)
    {
        const auto model_size{ models.size() };
        const auto solver_size{ solvers.size() };

        std::vector<int> row_length(solvers.size(), 5);
        int current_row_length = { 10 };

        for (size_t i{ 0 }; i != model_size; ++i) {
            for (size_t j{ 0 }; j != solver_size; ++j) {
                if (is_valid(array(i, j))) {
                    auto digits = get_digits_number(array(i, j));

                    if (digits > row_length[j])
                        row_length[j] = digits;
                }
            }
        }

        for (size_t i{ 0 }; i != model_size; ++i) {
            if (current[i].success && is_valid(current[i].solution)) {
                auto digits = get_digits_number(current[i].solution);

                if (digits > current_row_length)
                    current_row_length = digits;
            }
        }

        auto modelname_lenght_max =
          std::max(static_cast<std::string::size_type>(4),
                   std::max_element(models.cbegin(),
                                    models.cend(),
                                    [](const auto& lhs, const auto& rhs) {
                                        return lhs.size() < rhs.size();
                                    })
                     ->size());

        fmt::print("{:^{}} | ", "file", modelname_lenght_max);

        for (std::size_t solver{ 0 }; solver != solver_size; ++solver)
            fmt::print("{:>{}} ",
                       solvers[solver].name().substr(0, 10),
                       row_length[solver]);

        fmt::print("{:>{}}\n", name, current_row_length);

        for (size_t i{ 0 }; i != model_size; ++i) {
            fmt::print("{:^{}} | ", models[i].name(), modelname_lenght_max);

            auto lower = std::numeric_limits<double>::max();
            auto upper = std::numeric_limits<double>::lowest();

            for (std::size_t solver{ 0 }, end_solver(solvers.size());
                 solver != end_solver;
                 ++solver) {
                if (is_valid(array(i, solver)) && lower > array(i, solver))
                    lower = array(i, solver);

                if (is_valid(array(i, solver)) && upper < array(i, solver))
                    upper = array(i, solver);
            }

            if (current[i].success) {
                if (is_valid(current[i].solution) &&
                    lower > current[i].solution)
                    lower = current[i].solution;

                if (is_valid(current[i].solution) &&
                    upper < current[i].solution)
                    upper = current[i].solution;
            }

            for (std::size_t solver{ 0 }, end_solver(solvers.size());
                 solver != end_solver;
                 ++solver) {

                if (array(i, solver) == lower)
                    fmt::print(fg(fmt::color::green),
                               "{:>{}.3f} ",
                               array(i, solver),
                               row_length[solver]);
                else if (array(i, solver) == upper)
                    fmt::print(fg(fmt::color::blue),
                               "{:>{}.3f} ",
                               array(i, solver),
                               row_length[solver]);
                else
                    fmt::print(
                      "{:>{}.3f} ", array(i, solver), row_length[solver]);
            }

            if (current[i].solution == lower)
                fmt::print(fg(fmt::color::green),
                           "{:>{}.3f} ",
                           current[i].solution,
                           current_row_length);
            else if (current[i].solution == upper)
                fmt::print(fg(fmt::color::blue),
                           "{:>{}.3f} ",
                           current[i].solution,
                           current_row_length);
            else
                fmt::print(
                  "{:>{}.3f} ", current[i].solution, current_row_length);

            fmt::print("\n");
        }
    }